

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

_Bool modify_panel(term_conflict *t,wchar_t wy,wchar_t wx)

{
  uint32_t *puVar1;
  int iVar2;
  _Bool _Var3;
  wchar_t wy_00;
  int iVar4;
  wchar_t wVar5;
  
  if ((term_conflict *)angband_term[0] == t) {
    iVar2 = Term->sidebar_mode;
    iVar4 = (Term->hgt - (row_top_map[iVar2] + row_bottom_map[iVar2])) / (int)(uint)tile_height;
    wVar5 = ~col_map[iVar2] + Term->wid;
  }
  else {
    wVar5 = t->wid;
    iVar4 = t->hgt / (int)(uint)tile_height;
  }
  wy_00 = cave->height - iVar4;
  if (wy <= wy_00) {
    wy_00 = wy;
  }
  if (wy_00 < L'\x01') {
    wy_00 = L'\0';
  }
  wVar5 = cave->width - wVar5 / (int)(uint)tile_width;
  if (wx <= wVar5) {
    wVar5 = wx;
  }
  if (wVar5 < L'\x01') {
    wVar5 = L'\0';
  }
  _Var3 = panel_should_modify(t,wy_00,wVar5);
  if (_Var3) {
    t->offset_y = wy_00;
    t->offset_x = wVar5;
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x10000;
  }
  return _Var3;
}

Assistant:

bool modify_panel(term *t, int wy, int wx)
{
	int dungeon_hgt = cave->height;
	int dungeon_wid = cave->width;
	int screen_hgt = (t == angband_term[0]) ?
		SCREEN_HGT : t->hgt / tile_height;
	int screen_wid = (t == angband_term[0]) ?
		SCREEN_WID : t->wid / tile_width;

	/* Verify wy, adjust if needed */
	if (wy > dungeon_hgt - screen_hgt) wy = dungeon_hgt - screen_hgt;
	if (wy < 0) wy = 0;

	/* Verify wx, adjust if needed */
	if (wx > dungeon_wid - screen_wid) wx = dungeon_wid - screen_wid;
	if (wx < 0) wx = 0;

	/* React to changes */
	if (panel_should_modify(t, wy, wx)) {
		/* Save wy, wx */
		t->offset_y = wy;
		t->offset_x = wx;

		/* Redraw map */
		player->upkeep->redraw |= (PR_MAP);

		/* Changed */
		return (true);
	}

	/* No change */
	return (false);
}